

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::WriteCsvOutputFile(bool skipHeader,bool ordOutput)

{
  uint uVar1;
  bool bVar2;
  pointer ppVar3;
  iterator pvVar4;
  double *local_28;
  iterator typeIter;
  _Self local_18;
  iterator sumIter;
  bool ordOutput_local;
  bool skipHeader_local;
  
  sumIter._M_node._6_1_ = ordOutput;
  sumIter._M_node._7_1_ = skipHeader;
  if (!skipHeader) {
    if (ordOutput) {
      printf("SummaryId,SampleType,MeanLoss\n");
    }
    else {
      printf("summary_id,type,mean\n");
    }
  }
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
       ::begin((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                *)means_);
  while( true ) {
    typeIter = (iterator)
               std::
               map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
               ::end((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                      *)means_);
    bVar2 = std::operator!=(&local_18,(_Self *)&typeIter);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_std::array<double,_2UL>_>_>::operator->
                       (&local_18);
    local_28 = std::array<double,_2UL>::begin(&ppVar3->second);
    while( true ) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_std::array<double,_2UL>_>_>::operator->
                         (&local_18);
      pvVar4 = std::array<double,_2UL>::end(&ppVar3->second);
      if (local_28 == pvVar4) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_std::array<double,_2UL>_>_>::operator->
                         (&local_18);
      uVar1 = ppVar3->first;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_std::array<double,_2UL>_>_>::operator->
                         (&local_18);
      pvVar4 = std::array<double,_2UL>::begin(&ppVar3->second);
      printf("%d,%ld,%f\n",*local_28 / (double)nPeriods_,(ulong)uVar1,
             ((long)local_28 - (long)pvVar4 >> 3) + 1);
      local_28 = local_28 + 1;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_std::array<double,_2UL>_>_>::operator++(&local_18);
  }
  return;
}

Assistant:

inline void WriteCsvOutputFile(const bool skipHeader, const bool ordOutput) {

    if (!skipHeader) {
      if (ordOutput) {
        printf("SummaryId,SampleType,MeanLoss\n");
      } else {
        printf("summary_id,type,mean\n");
      }
    }

    for (auto sumIter = means_.begin(); sumIter != means_.end(); ++sumIter) {
      for (auto typeIter = sumIter->second.begin();
	   typeIter != sumIter->second.end(); ++typeIter) {

        printf("%d,%ld,%f\n",
	       sumIter->first,
	       typeIter - sumIter->second.begin() + 1,
	       (*typeIter) / nPeriods_);

      }
    }

  }